

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

int __thiscall Opt::parse_options(Opt *this,char **argv,int *i,bool *options_parsing)

{
  bool bVar1;
  int iVar2;
  byte *in_RCX;
  int *in_RDX;
  char **in_RSI;
  Opt *in_RDI;
  Opt *this_00;
  
  this_00 = in_RDI;
  if (((*in_RCX & 1) == 0) ||
     ((bVar1 = parse_flag(in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)in_RCX,(char *)in_RDI),
      !bVar1 && (bVar1 = parse_flag(this_00,in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)in_RCX,
                                    (char *)in_RDI), !bVar1)))) {
    if (((*in_RCX & 1) == 0) || (iVar2 = strcmp(in_RSI[*in_RDX],"--jinja"), iVar2 != 0)) {
      if (((*in_RCX & 1) != 0) &&
         (bVar1 = parse_flag(this_00,in_RSI,(int)((ulong)in_RDX >> 0x20),(char *)in_RCX,
                             (char *)in_RDI), bVar1)) {
        in_RDI->help = true;
        return 0;
      }
      if (((*in_RCX & 1) == 0) || (iVar2 = strcmp(in_RSI[*in_RDX],"--"), iVar2 != 0)) {
        return 2;
      }
      *in_RCX = 0;
    }
    else {
      in_RDI->use_jinja = true;
    }
  }
  else {
    in_RDI->verbose = true;
  }
  return 0;
}

Assistant:

int parse_options(const char ** argv, int & i, bool & options_parsing) {
        if (options_parsing && (parse_flag(argv, i, "-v", "--verbose") || parse_flag(argv, i, "-v", "--log-verbose"))) {
            verbose = true;
        } else if (options_parsing && strcmp(argv[i], "--jinja") == 0) {
            use_jinja = true;
        } else if (options_parsing && parse_flag(argv, i, "-h", "--help")) {
            help = true;
            return 0;
        } else if (options_parsing && strcmp(argv[i], "--") == 0) {
            options_parsing = false;
        } else {
            return 2;
        }

        return 0;
    }